

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_rawgeti(lua_State *L,int idx,lua_Integer n)

{
  int iVar1;
  Table *t;
  TValue *val;
  
  t = gettable(L,idx);
  val = luaH_getint(t,n);
  iVar1 = finishrawget(L,val);
  return iVar1;
}

Assistant:

LUA_API int lua_rawgeti (lua_State *L, int idx, lua_Integer n) {
  Table *t;
  lua_lock(L);
  t = gettable(L, idx);
  return finishrawget(L, luaH_getint(t, n));
}